

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsPixmapItem::setOffset(QGraphicsPixmapItem *this,QPointF *offset)

{
  long lVar1;
  bool bVar2;
  QGraphicsPixmapItemPrivate *lhs;
  qreal *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  QGraphicsPixmapItemPrivate *d;
  QRectF *in_stack_ffffffffffffffd8;
  QGraphicsItem *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = d_func((QGraphicsPixmapItem *)0x98adce);
  bVar2 = ::operator==((QPointF *)lhs,in_RDI);
  if (!bVar2) {
    QGraphicsItem::prepareGeometryChange((QGraphicsItem *)d);
    (lhs->offset).xp = *in_RSI;
    (lhs->offset).yp = in_RSI[1];
    lhs->hasShape = false;
    QRectF::QRectF((QRectF *)&stack0xffffffffffffffd8);
    QGraphicsItem::update(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsPixmapItem::setOffset(const QPointF &offset)
{
    Q_D(QGraphicsPixmapItem);
    if (d->offset == offset)
        return;
    prepareGeometryChange();
    d->offset = offset;
    d->hasShape = false;
    update();
}